

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

float ncnn::vstr_to_float(char *vstr)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *p;
  byte *pbVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  int iVar16;
  
  cVar1 = *vstr;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    vstr = vstr + 1;
  }
  bVar2 = *vstr;
  uVar4 = (int)(char)bVar2 - 0x30;
  if (uVar4 < 10) {
    uVar3 = 0;
    do {
      uVar3 = uVar4 + uVar3 * 10;
      bVar2 = ((byte *)vstr)[1];
      vstr = (char *)((byte *)vstr + 1);
      uVar4 = (int)(char)bVar2 - 0x30;
    } while (uVar4 < 10);
    dVar10 = (double)uVar3;
  }
  else {
    dVar10 = 0.0;
  }
  if (bVar2 == 0x2e) {
    pbVar8 = (byte *)vstr + 1;
    vstr = (char *)((byte *)vstr + 1);
    uVar4 = (int)(char)*pbVar8 - 0x30;
    dVar11 = 0.0;
    if (uVar4 < 10) {
      uVar3 = 1;
      uVar6 = 0;
      do {
        uVar6 = uVar4 + uVar6 * 10;
        uVar3 = uVar3 * 10;
        pbVar8 = (byte *)vstr + 1;
        vstr = (char *)((byte *)vstr + 1);
        uVar4 = (int)(char)*pbVar8 - 0x30;
      } while (uVar4 < 10);
      dVar11 = (double)uVar6 / (double)uVar3;
    }
    dVar10 = dVar10 + dVar11;
  }
  if ((byte)(*vstr | 0x20U) == 0x65) {
    bVar2 = ((byte *)vstr)[1];
    if ((bVar2 == 0x2d) || (bVar2 == 0x2b)) {
      pbVar8 = (byte *)vstr + 2;
    }
    else {
      pbVar8 = (byte *)vstr + 1;
    }
    uVar3 = (int)(char)*pbVar8 - 0x30;
    uVar4 = 0;
    if (uVar3 < 10) {
      uVar4 = 0;
      do {
        pbVar8 = pbVar8 + 1;
        uVar4 = uVar3 + uVar4 * 10;
        uVar3 = (int)(char)*pbVar8 - 0x30;
      } while (uVar3 < 10);
    }
    dVar11 = 1.0;
    for (; 7 < uVar4; uVar4 = uVar4 - 8) {
      dVar11 = dVar11 * 100000000.0;
    }
    if (uVar4 != 0) {
      dVar14 = 1.0;
      iVar16 = 2;
      do {
        dVar13 = dVar14;
        dVar12 = dVar11;
        dVar11 = dVar12 * 10.0;
        dVar14 = dVar13 * 10.0;
        iVar5 = iVar16 + -2;
        iVar7 = iVar16 + (uVar4 + 1 & 0xe);
        iVar16 = iVar5;
      } while (iVar7 != 4);
      uVar3 = -iVar5;
      iVar16 = -(uint)((int)(uVar4 - 1 ^ 0x80000000) < (int)(uVar3 ^ 0x80000000));
      iVar5 = -(uint)((int)(uVar4 - 1 ^ 0x80000000) < (int)((uVar3 | 1) ^ 0x80000000));
      auVar15._0_8_ = CONCAT44(iVar16,iVar16);
      auVar15._8_4_ = iVar5;
      auVar15._12_4_ = iVar5;
      dVar11 = (double)(~auVar15._8_8_ & (ulong)dVar14 | (ulong)dVar13 & auVar15._8_8_) *
               (double)(~auVar15._0_8_ & (ulong)dVar11 | (ulong)dVar12 & auVar15._0_8_);
    }
    if (bVar2 == 0x2d) {
      dVar10 = dVar10 / dVar11;
    }
    else {
      dVar10 = dVar10 * dVar11;
    }
  }
  fVar9 = (float)dVar10;
  if (cVar1 == '-') {
    fVar9 = -fVar9;
  }
  return fVar9;
}

Assistant:

static float vstr_to_float(const char vstr[16])
{
    double v = 0.0;

    const char* p = vstr;

    // sign
    bool sign = *p != '-';
    if (*p == '+' || *p == '-')
    {
        p++;
    }

    // digits before decimal point or exponent
    unsigned int v1 = 0;
    while (isdigit(*p))
    {
        v1 = v1 * 10 + (*p - '0');
        p++;
    }

    v = (double)v1;

    // digits after decimal point
    if (*p == '.')
    {
        p++;

        unsigned int pow10 = 1;
        unsigned int v2 = 0;

        while (isdigit(*p))
        {
            v2 = v2 * 10 + (*p - '0');
            pow10 *= 10;
            p++;
        }

        v += v2 / (double)pow10;
    }

    // exponent
    if (*p == 'e' || *p == 'E')
    {
        p++;

        // sign of exponent
        bool fact = *p != '-';
        if (*p == '+' || *p == '-')
        {
            p++;
        }

        // digits of exponent
        unsigned int expon = 0;
        while (isdigit(*p))
        {
            expon = expon * 10 + (*p - '0');
            p++;
        }

        double scale = 1.0;
        while (expon >= 8)
        {
            scale *= 1e8;
            expon -= 8;
        }
        while (expon > 0)
        {
            scale *= 10.0;
            expon -= 1;
        }

        v = fact ? v * scale : v / scale;
    }

    //     fprintf(stderr, "v = %f\n", v);
    return sign ? (float)v : (float)-v;
}